

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O0

dtl_dv_t * dtl_json_load(FILE *fh)

{
  int iVar1;
  undefined1 local_c0 [8];
  dtl_json_reader_t reader;
  ifstream_t ifstream;
  ifstream_handler_t handler;
  dtl_dv_t *retval;
  FILE *fh_local;
  
  handler.write = (_func_void_void_ptr_uint8_t_ptr_uint32_t *)0x0;
  dtl_json_reader_create((dtl_json_reader_t *)local_c0);
  memset(&ifstream.handler.write,0,0x20);
  ifstream.handler.write = (_func_void_void_ptr_uint8_t_ptr_uint32_t *)local_c0;
  ifstream_create(&reader.lastError,&ifstream.handler.write);
  iVar1 = ifstream_readTextFileFromHandle(&reader.lastError,fh);
  if (iVar1 == 0) {
    if (((reader.pEnd._1_1_ & 1) != 0) && (*(long *)reader._80_8_ != 0)) {
      handler.write = *(_func_void_void_ptr_uint8_t_ptr_uint32_t **)reader._80_8_;
      dtl_dv_inc_ref(*(undefined8 *)reader._80_8_);
    }
    dtl_json_reader_destroy((dtl_json_reader_t *)local_c0);
  }
  else {
    dtl_json_reader_destroy((dtl_json_reader_t *)local_c0);
  }
  return (dtl_dv_t *)handler.write;
}

Assistant:

dtl_dv_t* dtl_json_load(FILE *fh)
{
   dtl_dv_t *retval = (dtl_dv_t*) 0;
   ifstream_handler_t handler;
   ifstream_t ifstream;
   dtl_json_reader_t reader;
   dtl_json_reader_create(&reader);
   memset(&handler, 0, sizeof(handler));
   handler.arg = (void*) &reader;
   handler.write = dtl_json_reader_readChunk;
   handler.close = dtl_json_reader_close;
   ifstream_create(&ifstream, &handler);
   if (ifstream_readTextFileFromHandle(&ifstream, fh) == 0)
   {
      if ( (reader.parseComplete) && (reader.data->currentElem != 0) )
      {
         retval = reader.data->currentElem;
         dtl_dv_inc_ref(reader.data->currentElem);
      }
      dtl_json_reader_destroy(&reader);
   }
   else
   {
      dtl_json_reader_destroy(&reader);
   }
   return retval;
}